

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::btGeneric6DofConstraint
          (btGeneric6DofConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *frameInA,
          btTransform *frameInB,bool useLinearReferenceFrameA)

{
  undefined8 *in_RDI;
  byte in_R9B;
  btRigidBody *in_stack_ffffffffffffff58;
  btVector3 *this_00;
  btRigidBody *in_stack_ffffffffffffff60;
  btGeneric6DofConstraint *this_01;
  undefined8 in_stack_ffffffffffffff68;
  btTypedConstraint *in_stack_ffffffffffffff70;
  btRotationalLimitMotor *local_80;
  undefined8 *local_68;
  btTranslationalLimitMotor *this_02;
  
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff70,
             (btTypedConstraintType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *in_RDI = &PTR__btGeneric6DofConstraint_002e7098;
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff60,(btTransform *)in_stack_ffffffffffffff58);
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff60,(btTransform *)in_stack_ffffffffffffff58);
  this_02 = (btTranslationalLimitMotor *)(in_RDI + 0x19);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff60);
    this_02 = (btTranslationalLimitMotor *)((this_02->m_stopERP).m_floats + 2);
  } while (this_02 != (btTranslationalLimitMotor *)((long)in_RDI + 0x1c4));
  local_68 = (undefined8 *)((long)in_RDI + 0x1c4);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff60);
    local_68 = (undefined8 *)((long)local_68 + 0x54);
  } while (local_68 != in_RDI + 0x58);
  btTranslationalLimitMotor::btTranslationalLimitMotor(this_02);
  local_80 = (btRotationalLimitMotor *)((long)in_RDI + 0x37c);
  do {
    btRotationalLimitMotor::btRotationalLimitMotor(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != (btRotationalLimitMotor *)((long)in_RDI + 0x43c));
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff60);
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff60);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x98));
  this_00 = (btVector3 *)(in_RDI + 0x9a);
  this_01 = (btGeneric6DofConstraint *)(in_RDI + 0xa0);
  do {
    btVector3::btVector3(this_00);
    this_00 = (btVector3 *)(this_00->m_floats + 4);
  } while ((btGeneric6DofConstraint *)this_00 != this_01);
  btVector3::btVector3((btVector3 *)(in_RDI + 0xa0));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x51c));
  *(byte *)((long)in_RDI + 0x52c) = in_R9B & 1;
  *(undefined1 *)((long)in_RDI + 0x52d) = 1;
  *(undefined4 *)(in_RDI + 0xa6) = 0;
  *(undefined1 *)((long)in_RDI + 0x534) = 0;
  calculateTransforms(this_01);
  return;
}

Assistant:

btGeneric6DofConstraint::btGeneric6DofConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, bool useLinearReferenceFrameA)
: btTypedConstraint(D6_CONSTRAINT_TYPE, rbA, rbB)
, m_frameInA(frameInA)
, m_frameInB(frameInB),
m_useLinearReferenceFrameA(useLinearReferenceFrameA),
m_useOffsetForConstraintFrame(D6_USE_FRAME_OFFSET),
m_flags(0),
m_useSolveConstraintObsolete(D6_USE_OBSOLETE_METHOD)
{
	calculateTransforms();
}